

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int get_charset_map(char *ct,vm_val_t *cs)

{
  int iVar1;
  vm_obj_id_t vVar2;
  CCharmapToUni *pCVar3;
  size_t cnamelen;
  char *cname;
  size_t local_28;
  char *local_20;
  
  cs->typ = VM_NIL;
  (cs->val).obj = 0;
  if (ct == (char *)0x0) {
    return 3;
  }
  if ((ct[4] != '/' || *(int *)ct != 0x74786574) &&
     (iVar1 = bcmp(ct,"application/x-www-form-urlencoded",0x21), iVar1 != 0)) {
    return 3;
  }
  iVar1 = parse_attr_token(ct,"charset",&local_20,&local_28);
  if (iVar1 != 0) {
    vVar2 = CVmObjCharSet::create(0,local_20,local_28);
    cs->typ = VM_OBJ;
    (cs->val).obj = vVar2;
  }
  if ((cs->typ == VM_NIL) ||
     (pCVar3 = CVmObjCharSet::get_to_uni
                         ((CVmObjCharSet *)
                          ((long)&G_obj_table_X.pages_[(cs->val).obj >> 0xc]->ptr_ +
                          (ulong)(((cs->val).obj & 0xfff) * 0x18))), pCVar3 == (CCharmapToUni *)0x0)
     ) {
    vVar2 = CVmObjCharSet::create(0,"us-ascii",8);
    cs->typ = VM_OBJ;
    (cs->val).obj = vVar2;
  }
  return 1;
}

Assistant:

void CVmObjHTTPRequest::reload_from_image(VMG_ vm_obj_id_t self,
                                          const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);
}